

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall xmrig::App::App(App *this,Process *process)

{
  Controller *this_00;
  
  (this->super_IConsoleListener)._vptr_IConsoleListener = (_func_int **)&PTR__App_001b0440;
  (this->super_ISignalListener)._vptr_ISignalListener = (_func_int **)&PTR__App_001b0470;
  this->m_console = (Console *)0x0;
  this->m_controller = (Controller *)0x0;
  this->m_signals = (Signals *)0x0;
  this_00 = (Controller *)operator_new(0x28);
  Controller::Controller(this_00,process);
  this->m_controller = this_00;
  return;
}

Assistant:

xmrig::App::App(Process *process)
{
    m_controller = new Controller(process);
}